

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O1

void __thiscall crypto_tests::keccak_tests::test_method(keccak_tests *this)

{
  long lVar1;
  iterator in_R8;
  iterator in_R9;
  int i;
  int iVar2;
  int j;
  long lVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  lazy_ostream local_270;
  undefined1 *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  undefined **local_228;
  undefined1 local_220;
  undefined1 *local_218;
  char **local_210;
  string *local_208;
  char *local_200;
  char *local_1f8;
  assertion_result local_1f0;
  string local_1d8;
  uint256 out;
  CSHA256 tester;
  uint64_t state [25];
  uchar buf [8];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = 0;
  memset(&state,0,200);
  CSHA256::CSHA256(&tester);
  do {
    KeccakF(&state);
    lVar3 = 0;
    do {
      buf = *(uchar (*) [8])(state + lVar3);
      CSHA256::Write(&tester,buf,8);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x19);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0x40000);
  out.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  CSHA256::Finalize(&tester,(uchar *)&out);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x468;
  file.m_begin = (iterator)&local_240;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_250,msg);
  local_270.m_empty = false;
  local_270._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_260 = boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  base_blob<256u>::ToString_abi_cxx11_(&local_1d8,&out);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_1d8,"5f4a7f2eca7d57740ef9f1a077b4fc67328092ec62620447fe27ad8ed5f7e34f");
  local_1f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_1f0.m_message.px = (element_type *)0x0;
  local_1f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_1f8 = "";
  buf = (uchar  [8])&PTR__lazy_ostream_013d3d70;
  local_210 = &local_230;
  local_230 = "5f4a7f2eca7d57740ef9f1a077b4fc67328092ec62620447fe27ad8ed5f7e34f";
  local_220 = 0;
  local_228 = &PTR__lazy_ostream_013d4670;
  local_218 = boost::unit_test::lazy_ostream::inst;
  local_208 = &local_1d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1f0,&local_270,1,2,REQUIRE,0xe9fe14,(size_t)&local_200,0x468,buf,
             "\"5f4a7f2eca7d57740ef9f1a077b4fc67328092ec62620447fe27ad8ed5f7e34f\"",&local_228);
  boost::detail::shared_count::~shared_count(&local_1f0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(keccak_tests)
{
    // Start with the zero state.
    uint64_t state[25] = {0};
    CSHA256 tester;
    for (int i = 0; i < 262144; ++i) {
        KeccakF(state);
        for (int j = 0; j < 25; ++j) {
            unsigned char buf[8];
            WriteLE64(buf, state[j]);
            tester.Write(buf, 8);
        }
    }
    uint256 out;
    tester.Finalize(out.begin());
    // Expected hash of the concatenated serialized states after 1...262144 iterations of KeccakF.
    // Verified against an independent implementation.
    BOOST_CHECK_EQUAL(out.ToString(), "5f4a7f2eca7d57740ef9f1a077b4fc67328092ec62620447fe27ad8ed5f7e34f");
}